

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O1

void __thiscall glslang::TParseContext::inheritGlobalDefaults(TParseContext *this,TQualifier *dst)

{
  if ((*(uint *)&dst->field_0x8 & 0x7f) == 4) {
    if (((char)(*(ulong *)&dst->field_0x1c >> 0x38) == -1) &&
       ((this->super_TParseContextBase).super_TParseVersions.language == EShLangGeometry)) {
      *(ulong *)&dst->field_0x1c =
           *(ulong *)&dst->field_0x1c & 0xffffffffffffff |
           *(ulong *)&(this->globalOutputDefaults).field_0x1c & 0xff00000000000000;
    }
    if ((~(uint)*(ulong *)&dst->field_0x24 & 0xf) == 0) {
      *(ulong *)&dst->field_0x24 =
           *(ulong *)&dst->field_0x24 & 0xfffffffffffffff0 |
           (ulong)((uint)*(undefined8 *)&(this->globalOutputDefaults).field_0x24 & 0xf);
    }
  }
  return;
}

Assistant:

void TParseContext::inheritGlobalDefaults(TQualifier& dst) const
{
    if (dst.storage == EvqVaryingOut) {
        if (! dst.hasStream() && language == EShLangGeometry)
            dst.layoutStream = globalOutputDefaults.layoutStream;
        if (! dst.hasXfbBuffer())
            dst.layoutXfbBuffer = globalOutputDefaults.layoutXfbBuffer;
    }
}